

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialBus.cpp
# Opt level: O2

void __thiscall Commodore::Serial::DebugPort::set_input(DebugPort *this,Line line,LineLevel value)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined7 in_register_00000011;
  
  this->input_levels_[line] = value;
  poVar2 = std::operator<<((ostream *)&std::cout,"[Bus] ");
  pcVar3 = StringForLine(line);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2," is ");
  pcVar3 = "low";
  if ((int)CONCAT71(in_register_00000011,value) != 0) {
    pcVar3 = "high";
  }
  std::operator<<(poVar2,pcVar3);
  iVar1 = this->incoming_count_;
  if (iVar1 == 0) {
    this->incoming_count_ = ((byte)~(this->input_levels_[3] | this->input_levels_[2]) & 1) << 3;
  }
  else {
    if (value == High && line == Clock) {
      (this->super_Port).field_0x1d =
           this->input_levels_[3] << 7 | (byte)(this->super_Port).field_0x1d >> 1;
    }
    iVar1 = iVar1 + -1;
    this->incoming_count_ = iVar1;
    if (iVar1 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"[Bus] Observed value ");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::operator<<(poVar2,(uint)(byte)(this->super_Port).field_0x1d);
      return;
    }
  }
  return;
}

Assistant:

void DebugPort::set_input(Line line, LineLevel value) {
	input_levels_[line] = value;

	std::cout << "[Bus] " << StringForLine(line) << " is " << (value ? "high" : "low");
	if(!incoming_count_) {
		incoming_count_ = (!input_levels_[Line::Clock] && !input_levels_[Line::Data]) ? 8 : 0;
	} else {
		if(line == Line::Clock && value) {
			incoming_byte_ = (incoming_byte_ >> 1) | (input_levels_[Line::Data] ? 0x80 : 0x00);
		}
		incoming_count_--;
		if(incoming_count_ == 0) std::cout << "[Bus] Observed value " << std::hex << int(incoming_byte_);
	}
}